

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O2

void fld_mul(limb_t *res,limb_t *a,limb_t *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  
  lVar1 = *a;
  lVar2 = a[1];
  lVar3 = a[2];
  lVar22 = lVar3 * 0x13;
  lVar4 = a[3];
  lVar24 = lVar4 * 0x13;
  lVar5 = a[4];
  lVar6 = *b;
  lVar7 = b[4];
  uVar11 = lVar7 * lVar2 * 0x13;
  lVar14 = lVar5 * 0x13;
  uVar19 = uVar11 + lVar6 * lVar1;
  lVar8 = b[3];
  uVar17 = lVar8 * lVar22 + uVar19;
  lVar9 = b[2];
  uVar21 = lVar9 * lVar24 + uVar17;
  lVar10 = b[1];
  uVar12 = lVar10 * lVar14 + uVar21;
  lVar13 = SUB168(SEXT816(lVar10) * SEXT816(lVar14),8) +
           SUB168(SEXT816(lVar9) * SEXT816(lVar24),8) +
           SUB168(SEXT816(lVar8) * SEXT816(lVar22),8) +
           SUB168(SEXT816(lVar7) * SEXT816(lVar2 * 0x13),8) +
           SUB168(SEXT816(lVar6) * SEXT816(lVar1),8) + (ulong)CARRY8(uVar11,lVar6 * lVar1) +
           (ulong)CARRY8(lVar8 * lVar22,uVar19) + (ulong)CARRY8(lVar9 * lVar24,uVar17) +
           (ulong)CARRY8(lVar10 * lVar14,uVar21);
  uVar11 = lVar13 * 0x2000 | uVar12 >> 0x33;
  uVar17 = lVar7 * lVar22 + lVar6 * lVar2;
  uVar19 = uVar17 + lVar8 * lVar24;
  uVar21 = uVar19 + lVar9 * lVar14;
  uVar15 = uVar21 + lVar10 * lVar1;
  uVar16 = uVar15 + uVar11;
  lVar13 = SUB168(SEXT816(lVar7) * SEXT816(lVar22),8) + SUB168(SEXT816(lVar6) * SEXT816(lVar2),8) +
           (ulong)CARRY8(lVar7 * lVar22,lVar6 * lVar2) + SUB168(SEXT816(lVar8) * SEXT816(lVar24),8)
           + (ulong)CARRY8(uVar17,lVar8 * lVar24) + SUB168(SEXT816(lVar9) * SEXT816(lVar14),8) +
           (ulong)CARRY8(uVar19,lVar9 * lVar14) + SUB168(SEXT816(lVar10) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar21,lVar10 * lVar1) + (lVar13 >> 0x33) + (ulong)CARRY8(uVar15,uVar11);
  uVar15 = lVar13 * 0x2000 | uVar16 >> 0x33;
  uVar11 = lVar7 * lVar24 + lVar6 * lVar3;
  uVar17 = uVar11 + lVar8 * lVar14;
  uVar19 = uVar17 + lVar9 * lVar1;
  uVar21 = uVar19 + lVar10 * lVar2;
  uVar18 = uVar21 + uVar15;
  lVar13 = SUB168(SEXT816(lVar7) * SEXT816(lVar24),8) + SUB168(SEXT816(lVar6) * SEXT816(lVar3),8) +
           (ulong)CARRY8(lVar7 * lVar24,lVar6 * lVar3) + SUB168(SEXT816(lVar8) * SEXT816(lVar14),8)
           + (ulong)CARRY8(uVar11,lVar8 * lVar14) + SUB168(SEXT816(lVar9) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar17,lVar9 * lVar1) + SUB168(SEXT816(lVar10) * SEXT816(lVar2),8) +
           (ulong)CARRY8(uVar19,lVar10 * lVar2) + (lVar13 >> 0x33) + (ulong)CARRY8(uVar21,uVar15);
  uVar15 = lVar13 * 0x2000 | uVar18 >> 0x33;
  uVar11 = lVar7 * lVar14 + lVar6 * lVar4;
  uVar17 = uVar11 + lVar8 * lVar1;
  uVar19 = uVar17 + lVar9 * lVar2;
  uVar21 = uVar19 + lVar10 * lVar3;
  uVar20 = uVar21 + uVar15;
  lVar13 = SUB168(SEXT816(lVar7) * SEXT816(lVar14),8) + SUB168(SEXT816(lVar6) * SEXT816(lVar4),8) +
           (ulong)CARRY8(lVar7 * lVar14,lVar6 * lVar4) + SUB168(SEXT816(lVar8) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar11,lVar8 * lVar1) + SUB168(SEXT816(lVar9) * SEXT816(lVar2),8) +
           (ulong)CARRY8(uVar17,lVar9 * lVar2) + SUB168(SEXT816(lVar10) * SEXT816(lVar3),8) +
           (ulong)CARRY8(uVar19,lVar10 * lVar3) + (lVar13 >> 0x33) + (ulong)CARRY8(uVar21,uVar15);
  uVar23 = lVar13 * 0x2000 | uVar20 >> 0x33;
  uVar11 = lVar6 * lVar5 + lVar7 * lVar1;
  uVar17 = uVar11 + lVar8 * lVar2;
  uVar19 = uVar17 + lVar9 * lVar3;
  uVar21 = uVar19 + lVar10 * lVar4;
  uVar15 = uVar21 + uVar23;
  uVar11 = ((SUB168(SEXT816(lVar6) * SEXT816(lVar5),8) + SUB168(SEXT816(lVar7) * SEXT816(lVar1),8) +
             (ulong)CARRY8(lVar6 * lVar5,lVar7 * lVar1) + SUB168(SEXT816(lVar8) * SEXT816(lVar2),8)
             + (ulong)CARRY8(uVar11,lVar8 * lVar2) + SUB168(SEXT816(lVar9) * SEXT816(lVar3),8) +
             (ulong)CARRY8(uVar17,lVar9 * lVar3) + SUB168(SEXT816(lVar10) * SEXT816(lVar4),8) +
             (ulong)CARRY8(uVar19,lVar10 * lVar4) + (lVar13 >> 0x33) + (ulong)CARRY8(uVar21,uVar23))
            * 0x2000 | uVar15 >> 0x33) * 0x13 + (uVar12 & 0x7ffffffffffff);
  res[1] = (uVar16 & 0x7ffffffffffff) + ((long)uVar11 >> 0x33);
  *res = uVar11 & 0x7ffffffffffff;
  res[2] = uVar18 & 0x7ffffffffffff;
  res[3] = uVar20 & 0x7ffffffffffff;
  res[4] = uVar15 & 0x7ffffffffffff;
  return;
}

Assistant:

void
fld_mul(fld_t res, const fld_t a, const fld_t b)
{
	limb_t a19_1, a19_2, a19_3, a19_4, tmp;
	llimb_t c[5];

	a19_1 = 19*a[1];
	a19_2 = 19*a[2];
	a19_3 = 19*a[3];
	a19_4 = 19*a[4];

	c[0] = (llimb_t)a[0]*b[0] + (llimb_t)a19_1*b[4] + (llimb_t)a19_2*b[3]
		+ (llimb_t)a19_3*b[2] + (llimb_t)a19_4*b[1];
	c[1] = (llimb_t)a[0]*b[1] + (llimb_t)a[1]*b[0] + (llimb_t)a19_2*b[4]
		+ (llimb_t)a19_3*b[3] + (llimb_t)a19_4*b[2];
	c[2] = (llimb_t)a[0]*b[2] + (llimb_t)a[1]*b[1] + (llimb_t)a[2]*b[0]
		+ (llimb_t)a19_3*b[4] + (llimb_t)a19_4*b[3];
	c[3] = (llimb_t)a[0]*b[3] + (llimb_t)a[1]*b[2] + (llimb_t)a[2]*b[1]
		+ (llimb_t)a[3]*b[0] + (llimb_t)a19_4*b[4];
	c[4] = (llimb_t)a[0]*b[4] + (llimb_t)a[1]*b[3] + (llimb_t)a[2]*b[2]
		+ (llimb_t)a[3]*b[1] + (llimb_t)a[4]*b[0];


	c[1] += c[0] >> FLD_LIMB_BITS;
	c[2] += c[1] >> FLD_LIMB_BITS;
	c[3] += c[2] >> FLD_LIMB_BITS;
	c[4] += c[3] >> FLD_LIMB_BITS;

	tmp = (c[0] & FLD_LIMB_MASK) + 19*(c[4] >> FLD_LIMB_BITS);
	res[1] = (c[1] & FLD_LIMB_MASK) + (tmp >> FLD_LIMB_BITS);

	res[0] = tmp & FLD_LIMB_MASK;
	res[2] = c[2] & FLD_LIMB_MASK;
	res[3] = c[3] & FLD_LIMB_MASK;
	res[4] = c[4] & FLD_LIMB_MASK;
}